

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O2

void mtbdd_fprintdot_rec(FILE *out,MTBDD mtbdd)

{
  uint8_t *puVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  ulong uVar5;
  size_t sStack_30;
  
  puVar1 = nodes->data;
  lVar4 = (mtbdd & 0xffffffffff) * 0x10;
  uVar2 = *(ulong *)(puVar1 + lVar4);
  if ((uVar2 >> 0x3d & 1) != 0) {
    return;
  }
  uVar5 = mtbdd & 0x7fffffffffffffff;
  *(ulong *)(puVar1 + lVar4) = uVar2 | 0x2000000000000000;
  if (uVar5 == 0) {
    pcVar3 = "0 [shape=box, style=filled, label=\"F\"];\n";
    sStack_30 = 0x28;
  }
  else {
    if ((uVar2 >> 0x3e & 1) == 0) {
      fprintf((FILE *)out,"%lu [label=\"%u\"];\n",uVar5,*(ulong *)(puVar1 + lVar4 + 8) >> 0x28);
      mtbdd_fprintdot_rec(out,*(ulong *)(puVar1 + lVar4 + 8) & 0xffffffffff);
      mtbdd_fprintdot_rec(out,*(ulong *)(puVar1 + lVar4) & 0x800000ffffffffff);
      fprintf((FILE *)out,"%lu -> %lu [style=dashed];\n",uVar5,
              *(ulong *)(puVar1 + lVar4 + 8) & 0xffffffffff);
      pcVar3 = "dot";
      if (-1 < (long)*(ulong *)(puVar1 + lVar4)) {
        pcVar3 = "none";
      }
      fprintf((FILE *)out,"%lu -> %lu [style=solid dir=both arrowtail=%s];\n",uVar5,
              *(ulong *)(puVar1 + lVar4) & 0xffffffffff,pcVar3);
      return;
    }
    fprintf((FILE *)out,"%lu [shape=box, style=filled, label=\"",uVar5);
    mtbdd_fprint_leaf(out,mtbdd);
    pcVar3 = "\"];\n";
    sStack_30 = 4;
  }
  fwrite(pcVar3,sStack_30,1,(FILE *)out);
  return;
}

Assistant:

static void
mtbdd_fprintdot_rec(FILE *out, MTBDD mtbdd)
{
    mtbddnode_t n = MTBDD_GETNODE(mtbdd); // also works for mtbdd_false
    if (mtbddnode_getmark(n)) return;
    mtbddnode_setmark(n, 1);

    if (mtbdd == mtbdd_true || mtbdd == mtbdd_false) {
        fprintf(out, "0 [shape=box, style=filled, label=\"F\"];\n");
    } else if (mtbddnode_isleaf(n)) {
        fprintf(out, "%" PRIu64 " [shape=box, style=filled, label=\"", MTBDD_STRIPMARK(mtbdd));
        mtbdd_fprint_leaf(out, mtbdd);
        fprintf(out, "\"];\n");
    } else {
        fprintf(out, "%" PRIu64 " [label=\"%" PRIu32 "\"];\n",
                MTBDD_STRIPMARK(mtbdd), mtbddnode_getvariable(n));

        mtbdd_fprintdot_rec(out, mtbddnode_getlow(n));
        mtbdd_fprintdot_rec(out, mtbddnode_gethigh(n));

        fprintf(out, "%" PRIu64 " -> %" PRIu64 " [style=dashed];\n",
                MTBDD_STRIPMARK(mtbdd), mtbddnode_getlow(n));
        fprintf(out, "%" PRIu64 " -> %" PRIu64 " [style=solid dir=both arrowtail=%s];\n",
                MTBDD_STRIPMARK(mtbdd), MTBDD_STRIPMARK(mtbddnode_gethigh(n)),
                mtbddnode_getcomp(n) ? "dot" : "none");
    }
}